

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

void __thiscall dg::vr::ValueRelations::areMerged(ValueRelations *this,Handle to,Handle from)

{
  bool bVar1;
  iterator val_00;
  pointer ppVar2;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  *this_00;
  long in_RDI;
  V val;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  VectorSet<const_llvm::Value_*> fromVals;
  VectorSet<const_llvm::Value_*> *toVals;
  Bucket *in_stack_ffffffffffffff58;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffff60;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_68;
  undefined1 *local_60;
  _Base_ptr local_50;
  undefined1 local_48 [16];
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffffc8;
  Handle in_stack_ffffffffffffffd0;
  ValueRelations *this_01;
  
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  val_00 = std::
           map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
           ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                   *)in_stack_ffffffffffffff58,(key_type *)0x20a668);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                         *)0x20a67d);
  this_01 = (ValueRelations *)&ppVar2->second;
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  local_50 = (_Base_ptr)
             std::
             map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                     *)in_stack_ffffffffffffff58,(key_type *)0x20a6bd);
  std::
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                *)0x20a6cc);
  VectorSet<const_llvm::Value_*>::VectorSet
            (in_stack_ffffffffffffff60,(VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff58);
  local_60 = local_48;
  local_68._M_current =
       (Value **)
       VectorSet<const_llvm::Value_*>::begin
                 ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff58);
  VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator*(&local_68);
    add(this_01,(V)val_00._M_node,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_68);
  }
  this_00 = (map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             *)(in_RDI + 0x88);
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)this_00,in_stack_ffffffffffffff58);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::erase(this_00,(key_type *)in_stack_ffffffffffffff58);
  VectorSet<const_llvm::Value_*>::~VectorSet((VectorSet<const_llvm::Value_*> *)0x20a792);
  return;
}

Assistant:

void ValueRelations::areMerged(Handle to, Handle from) {
    VectorSet<V> &toVals = bucketToVals.find(to)->second;
    assert(bucketToVals.find(from) != bucketToVals.end());
    const VectorSet<V> fromVals = bucketToVals.find(from)->second;

    for (V val : fromVals)
        add(val, to, toVals);

    assert(bucketToVals.at(from).empty());
    bucketToVals.erase(from);
}